

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

HeapType __thiscall wasm::Type::getHeapType(Type *this)

{
  ulong uVar1;
  HeapType HVar2;
  
  uVar1 = this->id;
  if ((6 < uVar1) && ((uVar1 & 1) == 0)) {
    HVar2.id = uVar1 & 0xfffffffffffffff8;
    if ((uVar1 & 0xfffffffffffffffc) < 0x7d) {
      HVar2.id = uVar1 & 0xfffffffffffffffc;
    }
    return (HeapType)HVar2.id;
  }
  __assert_fail("isRef()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x183,"HeapType wasm::Type::getHeapType() const");
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }